

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cpp
# Opt level: O3

bool spvtools::opt::ExtInsMatch
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *extIndices,Instruction *insInst
               ,uint32_t extOffset)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  uVar2 = (uint32_t)
          ((ulong)((long)(extIndices->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        )._M_impl.super__Vector_impl_data._M_start) >> 2);
  uVar3 = uVar2 - extOffset;
  uVar4 = (insInst->has_result_id_ & 1) + 1;
  if (insInst->has_type_id_ == false) {
    uVar4 = (uint)insInst->has_result_id_;
  }
  if (uVar3 == ((int)((ulong)((long)(insInst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(insInst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
               uVar4) - 2) {
    bVar6 = true;
    if (uVar2 != extOffset) {
      lVar5 = 0;
      do {
        uVar2 = (extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[extOffset + (int)lVar5];
        uVar4 = (insInst->has_result_id_ & 1) + 1;
        if (insInst->has_type_id_ == false) {
          uVar4 = (uint)insInst->has_result_id_;
        }
        uVar1 = Instruction::GetSingleWordOperand(insInst,uVar4 + (int)lVar5 + 2);
        bVar6 = uVar2 == uVar1;
      } while ((bVar6) && (bVar7 = (ulong)uVar3 - 1 != lVar5, lVar5 = lVar5 + 1, bVar7));
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ExtInsMatch(const std::vector<uint32_t>& extIndices,
                 const Instruction* insInst, const uint32_t extOffset) {
  uint32_t numIndices = static_cast<uint32_t>(extIndices.size()) - extOffset;
  if (numIndices != insInst->NumInOperands() - 2) return false;
  for (uint32_t i = 0; i < numIndices; ++i)
    if (extIndices[i + extOffset] != insInst->GetSingleWordInOperand(i + 2))
      return false;
  return true;
}